

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::TryCast::Operation<duckdb::string_t,duckdb::hugeint_t>
          (TryCast *this,string_t input,hugeint_t *result,bool strict)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  idx_t iVar16;
  long lVar17;
  bool bVar18;
  ExponentData exponent;
  HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> state;
  IntegerCastData<short> local_c2;
  uint64_t *local_c0;
  undefined4 local_b4;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  HugeIntCastData<duckdb::hugeint_t,_duckdb::Hugeint,_long> local_98;
  undefined8 local_40;
  long local_38;
  
  local_c0 = input.value._8_8_;
  local_38 = input.value._0_8_;
  local_98.result.lower = 0;
  local_98.result.upper = 0;
  uVar10 = (ulong)this & 0xffffffff;
  if (uVar10 != 0) {
    lVar17 = input.value._0_8_;
    if ((uint)this < 0xd) {
      lVar17 = (long)&local_40 + 4;
    }
    uVar15 = 0;
    do {
      bVar4 = *(byte *)(lVar17 + uVar15);
      if ((4 < bVar4 - 9) && (bVar4 != 0x20)) {
        local_98.decimal_intermediate.upper = 0;
        local_98.decimal_intermediate_digits = 0;
        local_98._74_6_ = 0;
        local_98.decimal_total_digits = 0;
        local_98._50_6_ = 0;
        local_98.decimal_intermediate.lower = 0;
        local_98.decimal.lower = 0;
        local_98.decimal.upper = 0;
        local_98.intermediate = 0;
        local_98.digits = '\0';
        local_98._25_7_ = 0;
        local_98.result.lower = 0;
        local_98.result.upper = 0;
        local_b0 = uVar10 - uVar15;
        local_b4 = SUB84(result,0);
        local_40 = this;
        if (bVar4 == 0x2d) {
          uVar12 = 1;
          goto LAB_0028a1c5;
        }
        if ((uVar10 - 1 != uVar15) && (bVar4 == 0x30)) {
          bVar2 = *(byte *)(lVar17 + 1 + uVar15);
          if (bVar2 < 0x62) {
            if ((bVar2 == 0x42) || (bVar2 == 0x58)) {
LAB_0028a38d:
              if (0xfffffffffffffffd < (uVar10 - uVar15) - 3) {
                HugeIntegerCastOperation::
                Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                          (&local_98);
              }
              break;
            }
          }
          else if ((bVar2 == 0x62) || (bVar2 == 0x78)) goto LAB_0028a38d;
          if (((byte)(bVar2 - 0x30) < 10 & (byte)result) != 0) break;
        }
        if ((bVar4 == 0x2b & (byte)result) == 0) {
          uVar12 = (ulong)(bVar4 == 0x2b);
          local_a8 = uVar12;
          goto LAB_0028a451;
        }
        break;
      }
      uVar15 = uVar15 + 1;
    } while (uVar10 != uVar15);
  }
LAB_0028a420:
  bVar3 = false;
  goto LAB_0028a423;
  while( true ) {
    cVar1 = *(char *)(uVar15 + lVar17 + uVar12);
    bVar4 = cVar1 - 0x30;
    if (9 < bVar4) {
      if (cVar1 != '.') goto LAB_0028a3b2;
      if ((char)local_b4 != '\0') goto LAB_0028a420;
      uVar14 = uVar12 + 1;
      iVar7 = 3;
      uVar9 = uVar14;
      if (local_b0 <= uVar14) goto LAB_0028a6e1;
      goto LAB_0028a2ed;
    }
    uVar14 = uVar12 + 1;
    bVar3 = HugeIntegerCastOperation::
            HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
                      (&local_98,bVar4);
    if (bVar3) {
      bVar18 = true;
      if ((~uVar12 + uVar10 != uVar15) &&
         (*(char *)(uVar15 + 1 + lVar17 + uVar12) == '_' && (char)local_b4 == '\0')) {
        uVar14 = uVar12 + 2;
        if ((uVar10 - uVar12) - 2 == uVar15) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(*(char *)(uVar15 + lVar17 + uVar14) - 0x30U) < 10;
        }
      }
    }
    else {
      bVar18 = false;
    }
    bVar3 = false;
    uVar12 = uVar14;
    if (!bVar18) break;
LAB_0028a1c5:
    if (local_b0 <= uVar12) goto LAB_0028a29f;
  }
  goto LAB_0028a423;
  while( true ) {
    uVar11 = uVar9 + 1;
    if ((~uVar9 + uVar10 != uVar15) && (*(char *)(uVar15 + 1 + uVar9 + lVar17) == '_')) {
      lVar8 = uVar10 - uVar9;
      uVar11 = uVar9 + 2;
      uVar9 = uVar11;
      iVar5 = 1;
      if ((lVar8 - 2U == uVar15) || (9 < (byte)(*(char *)(uVar15 + lVar17 + uVar11) - 0x30U)))
      goto LAB_0028a6f3;
    }
    uVar9 = uVar11;
    uVar14 = local_a8;
    if (local_b0 <= uVar11) break;
LAB_0028a2ed:
    local_a8 = uVar14;
    bVar4 = *(char *)(uVar15 + uVar9 + lVar17) - 0x30;
    if (9 < bVar4) {
      iVar7 = 0;
      uVar14 = local_a8;
      goto LAB_0028a6e1;
    }
    bVar3 = HugeIntegerCastOperation::
            HandleDecimal<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true,true>
                      (&local_98,bVar4);
    if (!bVar3) {
      iVar5 = 1;
      goto LAB_0028a6f3;
    }
  }
  iVar7 = 3;
LAB_0028a6e1:
  iVar5 = 1;
  if (uVar14 < uVar9) {
    iVar5 = iVar7;
  }
  if (1 < uVar12) {
    iVar5 = iVar7;
  }
LAB_0028a6f3:
  uVar12 = uVar9;
  if (iVar5 != 3) {
    if (iVar5 != 0) goto LAB_0028a420;
LAB_0028a3b2:
    bVar4 = *(byte *)(uVar15 + lVar17 + uVar12);
    bVar3 = false;
    uVar6 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar6 - 9) goto LAB_0028a423;
    }
    else {
      if ((bVar4 == 0x65) || (uVar6 == 0x45)) {
        if ((uVar12 != 1 && (char)local_b4 == '\0') && (uVar12 + 1 < local_b0)) {
          local_c2.result = 0;
          pcVar13 = (char *)(uVar15 + lVar17 + uVar12 + 1);
          iVar16 = ~uVar15 + (uVar10 - uVar12);
          if (*pcVar13 == '-') {
            bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar13,iVar16,&local_c2,false);
          }
          else {
            bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar13,iVar16,&local_c2,false);
          }
          bVar3 = false;
          if (bVar18 != false) {
            bVar3 = HugeIntegerCastOperation::
                    HandleExponent<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>
                              (&local_98,(int)local_c2.result);
          }
          goto LAB_0028a423;
        }
        goto LAB_0028a420;
      }
      if (uVar6 != 0x20) goto LAB_0028a423;
    }
    uVar10 = uVar12 + 1;
    uVar12 = uVar10;
    if (uVar10 < local_b0) {
      do {
        bVar4 = *(byte *)(uVar15 + lVar17 + uVar10);
        if ((4 < bVar4 - 9) && (bVar4 != 0x20)) goto LAB_0028a420;
        uVar10 = uVar10 + 1;
        uVar12 = local_b0;
      } while (local_b0 != uVar10);
    }
  }
LAB_0028a29f:
  bVar3 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,true>(&local_98);
  if (bVar3) {
    bVar3 = 1 < uVar12;
    goto LAB_0028a423;
  }
  goto LAB_0028a64f;
  while( true ) {
    cVar1 = *(char *)(uVar15 + lVar17 + uVar12);
    bVar4 = cVar1 - 0x30;
    if (9 < bVar4) {
      if (cVar1 != '.') goto LAB_0028a5fb;
      if ((char)local_b4 != '\0') goto LAB_0028a420;
      uVar14 = uVar12 + 1;
      iVar7 = 3;
      uVar9 = uVar14;
      if (local_b0 <= uVar14) goto LAB_0028a7a1;
      goto LAB_0028a53c;
    }
    uVar14 = uVar12 + 1;
    bVar3 = HugeIntegerCastOperation::
            HandleDigit<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                      (&local_98,bVar4);
    if (bVar3) {
      bVar18 = true;
      if ((~uVar12 + uVar10 != uVar15) &&
         (*(char *)(uVar15 + 1 + lVar17 + uVar12) == '_' && (char)local_b4 == '\0')) {
        uVar14 = uVar12 + 2;
        if ((uVar10 - uVar12) - 2 == uVar15) {
          bVar18 = false;
        }
        else {
          bVar18 = (byte)(*(char *)(uVar15 + lVar17 + uVar14) - 0x30U) < 10;
        }
      }
    }
    else {
      bVar18 = false;
    }
    uVar12 = uVar14;
    bVar3 = false;
    if (!bVar18) break;
LAB_0028a451:
    if (local_b0 <= uVar12) goto LAB_0028a4ed;
  }
  goto LAB_0028a423;
  while( true ) {
    uVar11 = uVar9 + 1;
    if ((~uVar9 + uVar10 != uVar15) && (*(char *)(uVar15 + 1 + uVar9 + lVar17) == '_')) {
      lVar8 = uVar10 - uVar9;
      uVar11 = uVar9 + 2;
      uVar9 = uVar11;
      iVar5 = 1;
      if ((lVar8 - 2U == uVar15) || (9 < (byte)(*(char *)(uVar15 + lVar17 + uVar11) - 0x30U)))
      goto LAB_0028a7b4;
    }
    uVar9 = uVar11;
    uVar14 = local_a0;
    if (local_b0 <= uVar11) break;
LAB_0028a53c:
    local_a0 = uVar14;
    bVar4 = *(char *)(uVar15 + uVar9 + lVar17) - 0x30;
    if (9 < bVar4) {
      iVar7 = 0;
      uVar14 = local_a0;
      goto LAB_0028a7a1;
    }
    bVar3 = HugeIntegerCastOperation::
            HandleDecimal<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false,true>
                      (&local_98,bVar4);
    if (!bVar3) {
      iVar5 = 1;
      goto LAB_0028a7b4;
    }
  }
  iVar7 = 3;
LAB_0028a7a1:
  iVar5 = 1;
  if (uVar14 < uVar9) {
    iVar5 = iVar7;
  }
  if (local_a8 < uVar12) {
    iVar5 = iVar7;
  }
LAB_0028a7b4:
  uVar12 = uVar9;
  if (iVar5 != 3) {
    if (iVar5 != 0) goto LAB_0028a420;
LAB_0028a5fb:
    bVar4 = *(byte *)(uVar15 + lVar17 + uVar12);
    bVar3 = false;
    uVar6 = (uint)bVar4;
    if (bVar4 < 0x20) {
      if (4 < uVar6 - 9) goto LAB_0028a423;
    }
    else {
      if ((bVar4 == 0x65) || (uVar6 == 0x45)) {
        if ((uVar12 != local_a8 && (char)local_b4 == '\0') && (uVar12 + 1 < local_b0)) {
          local_c2.result = 0;
          pcVar13 = (char *)(uVar15 + lVar17 + uVar12 + 1);
          iVar16 = ~uVar15 + (uVar10 - uVar12);
          if (*pcVar13 == '-') {
            bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,true,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar13,iVar16,&local_c2,false);
          }
          else {
            bVar18 = IntegerCastLoop<duckdb::IntegerCastData<short>,false,false,duckdb::IntegerCastOperation,(char)46>
                               (pcVar13,iVar16,&local_c2,false);
          }
          bVar3 = false;
          if (bVar18 != false) {
            bVar3 = HugeIntegerCastOperation::
                    HandleExponent<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>
                              (&local_98,(int)local_c2.result);
          }
          goto LAB_0028a423;
        }
        goto LAB_0028a420;
      }
      if (uVar6 != 0x20) goto LAB_0028a423;
    }
    uVar10 = uVar12 + 1;
    uVar12 = uVar10;
    if (uVar10 < local_b0) {
      do {
        bVar4 = *(byte *)(uVar15 + lVar17 + uVar10);
        if ((4 < bVar4 - 9) && (bVar4 != 0x20)) goto LAB_0028a64f;
        uVar10 = uVar10 + 1;
        uVar12 = local_b0;
      } while (local_b0 != uVar10);
    }
  }
LAB_0028a4ed:
  bVar3 = HugeIntegerCastOperation::
          Finalize<duckdb::HugeIntCastData<duckdb::hugeint_t,duckdb::Hugeint,long>,false>(&local_98)
  ;
  if (bVar3) {
    bVar3 = local_a8 < uVar12;
    goto LAB_0028a423;
  }
LAB_0028a64f:
  bVar3 = false;
LAB_0028a423:
  if (bVar3 != false) {
    *local_c0 = local_98.result.lower;
    local_c0[1] = local_98.result.upper;
  }
  return bVar3;
}

Assistant:

bool TryCast::Operation(string_t input, hugeint_t &result, bool strict) {
	HugeIntCastData<hugeint_t, Hugeint, int64_t> state {};
	if (!TryIntegerCast<HugeIntCastData<hugeint_t, Hugeint, int64_t>, true, true, HugeIntegerCastOperation>(
	        input.GetData(), input.GetSize(), state, strict)) {
		return false;
	}
	result = state.result;
	return true;
}